

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

void LidlNormalizerTests(void)

{
  CMOptions Options;
  undefined1 auVar1 [24];
  CMReturn In;
  ConfusableMatcher *this;
  pointer ptVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  chr;
  tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
  entry;
  CMReturn res;
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  data;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  string local_150;
  _Alloc_hider local_130;
  size_t in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  _Alloc_hider local_e8;
  size_type in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  void *pvStack_a0;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 uStack_88;
  undefined7 uStack_87;
  undefined1 uStack_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  undefined8 local_70;
  void *pvStack_68;
  CMReturn local_60;
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  local_48;
  
  this = LidlNormalizerCMSetup();
  LidlNormalizerData_abi_cxx11_();
  local_a8 = 0;
  pvStack_a0 = (void *)0x0;
  if (local_48.
      super__Vector_base<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar2 = local_48.
             super__Vector_base<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e8,
             &(ptVar2->
              super__Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>
              ).
              super__Head_base<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_head_impl);
      local_188 = 0;
      local_180 = 0;
      local_170 = &local_160;
      local_168 = 0;
      local_160 = 0;
      local_190 = &local_180;
      std::__cxx11::string::_M_assign((string *)&local_190);
      std::__cxx11::string::_M_assign((string *)&local_170);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_190,local_190 + local_188);
      local_130._M_p = &stack0xfffffffffffffee0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_170,local_170 + local_168);
      local_90 = 1;
      uStack_7f = 0;
      uStack_8f = 0;
      uStack_88 = 0;
      uStack_87 = 0;
      uStack_80 = 0;
      uStack_78 = 1000000000;
      local_70 = local_a8;
      pvStack_68 = pvStack_a0;
      auVar1 = ZEXT924((unkuint9)1);
      Options.TimeoutNs = 1000000000;
      Options.MatchRepeating = (bool)auVar1[0];
      Options._1_7_ = auVar1._1_7_;
      Options.StartIndex = auVar1._8_8_;
      Options.StartFromEnd = (bool)auVar1[0x10];
      Options._17_7_ = auVar1._17_7_;
      Options._32_8_ = local_a8;
      Options.ContainsPosPointers = pvStack_a0;
      ConfusableMatcher::IndexOf(&local_60,this,&local_150,(string *)&local_130,Options);
      if (local_130._M_p != &stack0xfffffffffffffee0) {
        operator_delete(local_130._M_p,in_stack_fffffffffffffee0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      In.Size = in_stack_ffffffffffffff28;
      In.Start = in_stack_ffffffffffffff20;
      In._16_8_ = in_stack_ffffffffffffff30;
      AssertMatch(In,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (local_170 != &local_160) {
        operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      if (local_e8._M_p != &stack0xffffffffffffff28) {
        operator_delete(local_e8._M_p,in_stack_ffffffffffffff28 + 1);
      }
      ptVar2 = ptVar2 + 1;
    } while (ptVar2 != local_48.
                       super__Vector_base<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ConfusableMatcher::~ConfusableMatcher(this);
  operator_delete(this,0x2000);
  std::
  vector<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::allocator<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void LidlNormalizerTests()
{
	auto matcher = LidlNormalizerCMSetup();
	auto data = LidlNormalizerData();
	auto opts = LidlNormalizerOpts();

	for (auto entry : data) {
		std::pair<std::string, std::string> chr;
		std::pair<int, int> eq;
		std::tie(chr, eq) = entry;
		auto res = matcher->IndexOf(chr.first, chr.second, opts);
		AssertMatch(res, eq.first, eq.second);
	}

	delete matcher;
}